

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_platform.c
# Opt level: O0

size_t light_size(__fd_t fd)

{
  long __off;
  size_t sVar1;
  FILE *in_RDI;
  size_t current;
  size_t size;
  
  __off = ftell(in_RDI);
  fseek(in_RDI,0,2);
  sVar1 = ftell(in_RDI);
  fseek(in_RDI,__off,0);
  return sVar1;
}

Assistant:

size_t light_size(__fd_t fd)
{
	size_t size = 0;
	size_t current = ftell(fd);

	fseek(fd, 0, SEEK_END);
	size = ftell(fd);
	fseek(fd, current, SEEK_SET);

	return size;
}